

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vpu720.c
# Opt level: O2

MPP_RET hal_jpege_vpu720_init(void *hal,MppEncHalCfg *cfg)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  void *pvVar2;
  char *fmt;
  int level;
  MppBufferGroup group;
  ulong uVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  mpp_env_get_u32("hal_jpege_debug",&hal_jpege_debug,0);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","hal_jpege_vpu720_init",0x7b);
  }
  pvVar2 = mpp_osal_calloc("hal_jpege_vpu720_init",300);
  *(void **)((long)hal + 0x70) = pvVar2;
  *(MppEncCfgSet **)((long)hal + 0x80) = cfg->cfg;
  *(undefined4 *)((long)hal + 0x78) = 0;
  *(undefined4 *)((long)hal + 0x88) = 1;
  cfg->type = VPU_CLIENT_JPEG_ENC;
  MVar1 = mpp_dev_init(&cfg->dev,VPU_CLIENT_JPEG_ENC);
  if (MVar1 == MPP_OK) {
    *(MppDev *)((long)hal + 0x68) = cfg->dev;
    jpege_bits_init((JpegeBits *)((long)hal + 0xf0));
    if ((*(long *)((long)hal + 0xf0) == 0) &&
       (_mpp_log_l(2,"hal_jpege_vpu720","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->bits",
                   "hal_jpege_vpu720_init",CONCAT44(uVar4,0x8b)), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    group = *(MppBufferGroup *)((long)hal + 0x1b8);
    if (group == (MppBufferGroup)0x0) {
      MVar1 = mpp_buffer_group_get
                        ((MppBufferGroup *)((long)hal + 0x1b8),MPP_BUFFER_TYPE_ION,
                         MPP_BUFFER_INTERNAL,"hal_jpege_vpu720","hal_jpege_vpu720_init");
      if (MVar1 != MPP_OK) {
        fmt = "mpp_buffer_group_get failed ret %d\n";
        goto LAB_002399a1;
      }
      group = *(MppBufferGroup *)((long)hal + 0x1b8);
    }
    MVar1 = mpp_buffer_get_with_tag
                      (group,(MppBuffer *)((long)hal + 0x1c0),0x180,"hal_jpege_vpu720",
                       "hal_jpege_vpu720_init");
    mpp_buffer_attach_dev_f
              ("hal_jpege_vpu720_init",*(MppBuffer *)((long)hal + 0x1c0),
               *(MppDev *)((long)hal + 0x68));
    pvVar2 = mpp_osal_calloc("hal_jpege_vpu720_init",0x180);
    *(void **)((long)hal + 0x1c8) = pvVar2;
    if (((byte)hal_jpege_debug & 1) == 0) {
      return MVar1;
    }
    fmt = "(%d) leave\n";
    level = 4;
    uVar3 = 0x98;
  }
  else {
    fmt = "mpp_dev_init failed. ret: %d\n";
LAB_002399a1:
    level = 2;
    uVar3 = (ulong)(uint)MVar1;
  }
  _mpp_log_l(level,"hal_jpege_vpu720",fmt,"hal_jpege_vpu720_init",uVar3);
  return MVar1;
}

Assistant:

static MPP_RET hal_jpege_vpu720_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    JpegeVpu720HalCtx *ctx = (JpegeVpu720HalCtx *)hal;

    mpp_env_get_u32("hal_jpege_debug", &hal_jpege_debug, 0);

    hal_jpege_enter();

    ctx->regs   = mpp_calloc(JpegeVpu720Reg, 1);
    ctx->cfg    = cfg->cfg;

    ctx->frame_cnt = 0;
    ctx->enc_mode = JPEG_VPU720_ENC_MODE_ONE_FRAME;
    cfg->type = VPU_CLIENT_JPEG_ENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }

    ctx->dev = cfg->dev;
    jpege_bits_init(&ctx->bits);
    mpp_assert(ctx->bits);
    if (ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err_f("mpp_buffer_group_get failed ret %d\n", ret);
            return ret;
        }
    }

    ret = mpp_buffer_get(ctx->group, &ctx->qtbl_buffer, JPEGE_VPU720_QTABLE_SIZE * sizeof(RK_U16));
    mpp_buffer_attach_dev(ctx->qtbl_buffer, ctx->dev);
    ctx->qtbl_sw_buf = (RK_U16 *)mpp_calloc(RK_U16, JPEGE_VPU720_QTABLE_SIZE);

    hal_jpege_leave();
    return ret;
}